

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelCase::~TextureLevelCase
          (TextureLevelCase *this)

{
  pointer this_00;
  long lVar1;
  allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec> *extraout_RDX;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureLevelCase_01e56b70;
  deinit(this);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_failedIterations).super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Destroy<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec*,deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>
            ((this->m_iterations).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_iterations).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
             ._M_impl.super__Vector_impl_data._M_finish,extraout_RDX);
  this_00 = (this->m_iterations).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar1 = (long)(this->m_iterations).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)this_00;
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
  ::_M_deallocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
                   *)this_00,(pointer)(lVar1 / 0x58),lVar1 % 0x58);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

TextureLevelCase::~TextureLevelCase (void)
{
	deinit();
}